

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_chain_maximal_simplex_removal<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false,true>>>
               (Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_true>_>
                *m)

{
  pointer puVar1;
  pointer pvVar2;
  _Hash_node_base *p_Var3;
  uint uVar4;
  Index lastIndex;
  undefined4 local_128;
  undefined4 local_124;
  undefined1 *local_120;
  undefined4 *local_118;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  shared_count sStack_e8;
  undefined **local_e0;
  undefined1 local_d8;
  undefined8 *local_d0;
  undefined1 **local_c8;
  undefined **local_c0;
  undefined1 local_b8;
  undefined8 *local_b0;
  undefined4 **local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined8 *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_chain_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false,true>>>>
            ();
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false,true>>>
            (&columns,m);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x388);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_0024fee0;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_124 = (undefined4)(m->matrix_).matrix_._M_h._M_element_count;
  local_118 = &local_124;
  local_128 = 7;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_a8 = &local_118;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0024fe50;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_120;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0024fea0;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_120 = (undefined1 *)&local_128;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_e8);
  if (((m->matrix_).nextIndex_ != 0) && ((m->matrix_).matrix_._M_h._M_element_count != 0)) {
    p_Var3 = (m->matrix_).pivotToColumnIndex_._M_h._M_before_begin._M_nxt;
    if (p_Var3 == (_Hash_node_base *)0x0) {
      lastIndex = 0;
    }
    else {
      uVar4 = 0;
      lastIndex = 0;
      do {
        if (uVar4 < *(uint *)&p_Var3[1]._M_nxt) {
          lastIndex = *(Index *)((long)&p_Var3[1]._M_nxt + 4);
          uVar4 = *(uint *)&p_Var3[1]._M_nxt;
        }
        p_Var3 = p_Var3->_M_nxt;
      } while (p_Var3 != (_Hash_node_base *)0x0);
    }
    Gudhi::persistence_matrix::
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_true,_true,_false,_true>_>_>
    ::_remove_last(&m->matrix_,lastIndex);
  }
  puVar1 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pvVar2 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
  if (puVar1 != (pointer)0x0) {
    pvVar2 = columns.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    columns.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         columns.
         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    operator_delete(puVar1,(long)(pvVar2->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
    pvVar2 = columns.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  columns.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,true,true,false,true>>>
            (&columns,m);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x396);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_0024fee0;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_124 = (undefined4)(m->matrix_).matrix_._M_h._M_element_count;
  local_128 = 6;
  sStack_e8.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_118 = &local_124;
  local_b8 = 0;
  local_c0 = &PTR__lazy_ostream_0024fe50;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_118;
  local_d8 = 0;
  local_e0 = &PTR__lazy_ostream_0024fea0;
  local_d0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_120;
  local_120 = (undefined1 *)&local_128;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_e8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_chain_maximal_simplex_removal(Matrix& m) {
  auto columns = build_simple_chain_matrix<typename Matrix::Column>();

  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 7);
  if constexpr (Matrix::Option_list::has_column_pairings) {
    BOOST_CHECK_EQUAL(m.get_current_barcode().back().death, 6);
  }

  if constexpr (Matrix::Option_list::has_vine_update && Matrix::Option_list::has_map_column_container &&
                Matrix::Option_list::has_column_pairings) {
    m.remove_maximal_cell(6);
  } else {
    m.remove_last();
  }

  columns.pop_back();
  test_content_equality(columns, m);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 6);
  if constexpr (Matrix::Option_list::has_column_pairings) {
    BOOST_CHECK_EQUAL(m.get_current_barcode().back().death,
                      Matrix::template get_null_value<typename Matrix::ID_index>());
  }
}